

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_io.c
# Opt level: O2

int lj_cf_io_type(lua_State *L)

{
  TValue *pTVar1;
  ulong uVar2;
  char *str;
  size_t sStack_10;
  
  pTVar1 = lj_lib_checkany(L,1);
  if (((pTVar1->field_4).it >> 0xf == 0x1fff3) &&
     (uVar2 = (ulong)pTVar1->field_4 & 0x7fffffffffff, *(char *)(uVar2 + 10) == '\x01')) {
    if (*(long *)(uVar2 + 0x30) == 0) {
      str = "closed file";
      sStack_10 = 0xb;
    }
    else {
      str = "file";
      sStack_10 = 4;
    }
    lua_pushlstring(L,str,sStack_10);
  }
  else {
    pTVar1 = L->top;
    L->top = pTVar1 + 1;
    pTVar1->u64 = 0xffffffffffffffff;
  }
  return 1;
}

Assistant:

LJLIB_CF(io_type)
{
  cTValue *o = lj_lib_checkany(L, 1);
  if (!(tvisudata(o) && udataV(o)->udtype == UDTYPE_IO_FILE))
    setnilV(L->top++);
  else if (((IOFileUD *)uddata(udataV(o)))->fp != NULL)
    lua_pushliteral(L, "file");
  else
    lua_pushliteral(L, "closed file");
  return 1;
}